

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O0

void Open_JTalk_refresh(Open_JTalk *open_jtalk)

{
  int iVar1;
  JPCommon *in_RDI;
  
  if (in_RDI != (JPCommon *)0x0) {
    iVar1 = JPCommon_get_label_size(in_RDI);
    if (2 < iVar1) {
      HTS_Engine_refresh((HTS_Engine *)0x19d9fd);
    }
    JPCommon_refresh((JPCommon *)0x19da0a);
    NJD_refresh((NJD *)0x19da17);
    Mecab_refresh(&open_jtalk->mecab);
  }
  return;
}

Assistant:

void Open_JTalk_refresh(Open_JTalk *open_jtalk)
{
	if (open_jtalk == NULL)
	{
		return;
	}
	if (JPCommon_get_label_size(&open_jtalk->jpcommon) > 2)
	{
		HTS_Engine_refresh(&open_jtalk->engine);
	}
	JPCommon_refresh(&open_jtalk->jpcommon);
	NJD_refresh(&open_jtalk->njd);
	Mecab_refresh(&open_jtalk->mecab);
}